

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O3

void __thiscall Diligent::FenceVkImpl::Wait(FenceVkImpl *this,Uint64 Value)

{
  atomic<unsigned_long> *paVar1;
  VulkanLogicalDevice *this_00;
  ulong uVar2;
  VkResult VVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  _Elt_pointer pSVar8;
  bool bVar9;
  string msg_1;
  string msg;
  Uint64 local_80;
  undefined1 local_78 [32];
  Uint64 *local_58;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_80 = Value;
  if ((this->m_TimelineSemaphore).m_VkObject == (VkSemaphore_T *)0x0) {
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_SyncPointsGuard);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    pSVar8 = (this->m_SyncPoints).
             super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->m_SyncPoints).
        super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != pSVar8) {
      this_00 = (((this->super_FenceBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                 .m_pDevice)->m_LogicalVkDevice).
                super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      do {
        if (local_80 < pSVar8->Value) break;
        local_50._0_8_ =
             (((pSVar8->SyncPoint).
               super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_Fence).m_VkSyncObject;
        VVar3 = VulkanUtilities::VulkanLogicalDevice::GetFenceStatus
                          (this_00,(VkFence)local_50._0_8_);
        if (VVar3 == VK_NOT_READY) {
          VVar3 = VulkanUtilities::VulkanLogicalDevice::WaitForFences
                            (this_00,1,(VkFence *)local_50,1,0xffffffffffffffff);
        }
        if (VVar3 != VK_SUCCESS) {
          FormatString<char[41]>
                    ((string *)local_78,(char (*) [41])"All pending fences must now be complete!");
          DebugAssertionFailed
                    ((Char *)local_78._0_8_,"Wait",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                     ,0xe4);
          if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
            operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
          }
        }
        uVar2 = pSVar8->Value;
        uVar5 = (this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue.
                super___atomic_base<unsigned_long>._M_i;
        do {
          uVar7 = uVar2;
          if (uVar2 < uVar5) {
            uVar7 = uVar5;
          }
          paVar1 = &(this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue;
          LOCK();
          uVar6 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
          bVar9 = uVar5 == uVar6;
          if (bVar9) {
            (paVar1->super___atomic_base<unsigned_long>)._M_i = uVar7;
            uVar6 = uVar5;
          }
          UNLOCK();
          uVar5 = uVar6;
        } while (!bVar9);
        std::
        deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
        ::pop_front(&this->m_SyncPoints);
        pSVar8 = (this->m_SyncPoints).
                 super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
      } while ((this->m_SyncPoints).
               super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur != pSVar8);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_SyncPointsGuard);
  }
  else {
    local_78._24_8_ = &(this->m_TimelineSemaphore).m_VkObject;
    local_78._8_8_ = (void *)0x0;
    local_78._0_8_ = (pointer)0x3b9df29c;
    local_78._16_8_ = 0x100000000;
    local_58 = &local_80;
    VVar3 = VulkanUtilities::VulkanLogicalDevice::WaitSemaphores
                      ((((this->super_FenceBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                        .m_pDevice)->m_LogicalVkDevice).
                       super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(VkSemaphoreWaitInfo *)local_78,0xffffffffffffffff);
    if (VVar3 != VK_SUCCESS) {
      FormatString<char[34]>((string *)local_50,(char (*) [34])"Failed to wait timeline semaphore");
      DebugAssertionFailed
                ((Char *)local_50._0_8_,"Wait",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                 ,0xd0);
      if ((VkFence)local_50._0_8_ != (VkFence)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void FenceVkImpl::Wait(Uint64 Value)
{
    if (IsTimelineSemaphore())
    {
        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();

        VkSemaphoreWaitInfo WaitInfo{};
        WaitInfo.sType          = VK_STRUCTURE_TYPE_SEMAPHORE_WAIT_INFO;
        WaitInfo.pNext          = nullptr;
        WaitInfo.flags          = 0;
        WaitInfo.semaphoreCount = 1;
        WaitInfo.pSemaphores    = &m_TimelineSemaphore;
        WaitInfo.pValues        = &Value;

        VkResult err = LogicalDevice.WaitSemaphores(WaitInfo, UINT64_MAX);
        DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to wait timeline semaphore");
    }
    else
    {
        std::lock_guard<std::mutex> Lock{m_SyncPointsGuard};

        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();
        while (!m_SyncPoints.empty())
        {
            SyncPointData& Item = m_SyncPoints.front();
            if (Item.Value > Value)
                break;

            VkFence  Fence  = Item.SyncPoint->GetFence();
            VkResult status = LogicalDevice.GetFenceStatus(Fence);
            if (status == VK_NOT_READY)
            {
                status = LogicalDevice.WaitForFences(1, &Fence, VK_TRUE, UINT64_MAX);
            }

            DEV_CHECK_ERR(status == VK_SUCCESS, "All pending fences must now be complete!");
            UpdateLastCompletedFenceValue(Item.Value);

            m_SyncPoints.pop_front();
        }
    }
}